

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

void __thiscall cmFileAPI::WriteReplies(cmFileAPI *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ValueHolder local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_58;
  string local_38;
  
  if (this->QueryExists == true) {
    pcVar1 = (this->APIv1)._M_dataplus._M_p;
    local_80[0].string_ = (char *)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + (this->APIv1)._M_string_length);
    std::__cxx11::string::append((char *)&local_80[0].int_);
    cmsys::SystemTools::MakeDirectory((string *)local_80,(mode_t *)0x0);
    if (local_80[0] != &local_70) {
      operator_delete(local_80[0].string_,local_70._M_allocated_capacity + 1);
    }
    BuildReplyIndex((Value *)local_80,this);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"index","");
    WriteJsonFile(&local_38,this,(Value *)local_80,&local_58,ComputeSuffixTime);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)local_80);
  }
  RemoveOldReplyFiles(this);
  return;
}

Assistant:

void cmFileAPI::WriteReplies()
{
  if (this->QueryExists) {
    cmSystemTools::MakeDirectory(this->APIv1 + "/reply");
    this->WriteJsonFile(this->BuildReplyIndex(), "index", ComputeSuffixTime);
  }

  this->RemoveOldReplyFiles();
}